

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInvert.cpp
# Opt level: O3

void anon_unknown.dwarf_8a53c::invertM33f(M33f *m,float e)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float *pfVar7;
  undefined8 *puVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  Matrix33<float> tmp_1;
  Matrix33<float> tmp;
  M33f inv2;
  M33f inv1;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  Matrix33<float> local_60;
  Matrix33<float> local_3c;
  
  Imath_3_2::Matrix33<float>::inverse(&local_3c,m);
  Imath_3_2::Matrix33<float>::gjInverse(&local_60,m);
  fVar19 = local_3c.x[1][1];
  fVar20 = local_3c.x[1][2];
  fVar1 = m->x[1][1];
  fVar12 = (float)*(undefined8 *)(m->x[0] + 1);
  fVar2 = m->x[1][0];
  fVar13 = (float)*(undefined8 *)m->x[0];
  fVar14 = local_3c.x[0][1];
  fVar15 = local_3c.x[0][2];
  fVar3 = m->x[1][2];
  fVar18 = (float)*(undefined8 *)(m->x[0] + 2);
  fVar16 = local_3c.x[2][1];
  fVar17 = local_3c.x[2][2];
  pfVar7 = &local_88;
  local_88 = local_3c.x[2][0] * fVar18 + local_3c.x[0][0] * fVar13 + local_3c.x[1][0] * fVar12;
  fStack_84 = fVar16 * fVar18 + fVar14 * fVar13 + fVar19 * fVar12;
  fStack_80 = fVar17 * fVar18 + fVar15 * fVar13 + fVar20 * fVar12;
  fStack_7c = local_3c.x[2][0] * fVar3 + local_3c.x[0][0] * fVar2 + local_3c.x[1][0] * fVar1;
  fVar4 = m->x[2][0];
  fVar5 = m->x[2][1];
  fVar6 = m->x[2][2];
  local_78 = fVar16 * fVar3 + fVar14 * fVar2 + fVar19 * fVar1;
  fStack_74 = fVar17 * fVar3 + fVar15 * fVar2 + fVar20 * fVar1;
  fStack_70 = local_3c.x[2][0] * fVar6 + local_3c.x[0][0] * fVar4 + local_3c.x[1][0] * fVar5;
  fStack_6c = fVar16 * fVar6 + fVar14 * fVar4 + fVar19 * fVar5;
  local_68 = fVar17 * fVar6 + fVar15 * fVar4 + fVar20 * fVar5;
  fVar19 = local_60.x[1][1];
  fVar20 = local_60.x[1][2];
  fVar14 = local_60.x[0][1];
  fVar15 = local_60.x[0][2];
  fVar16 = local_60.x[2][1];
  fVar17 = local_60.x[2][2];
  local_b8 = local_60.x[2][0] * fVar18 + local_60.x[0][0] * fVar13 + local_60.x[1][0] * fVar12;
  fStack_b4 = fVar16 * fVar18 + fVar14 * fVar13 + fVar19 * fVar12;
  fStack_b0 = fVar17 * fVar18 + fVar15 * fVar13 + fVar20 * fVar12;
  fStack_ac = local_60.x[2][0] * fVar3 + local_60.x[0][0] * fVar2 + local_60.x[1][0] * fVar1;
  local_a8 = fVar16 * fVar3 + fVar14 * fVar2 + fVar19 * fVar1;
  fStack_a4 = fVar17 * fVar3 + fVar15 * fVar2 + fVar20 * fVar1;
  fStack_a0 = local_60.x[2][0] * fVar6 + local_60.x[0][0] * fVar4 + local_60.x[1][0] * fVar5;
  fStack_9c = fVar16 * fVar6 + fVar14 * fVar4 + fVar19 * fVar5;
  local_98 = fVar17 * fVar6 + fVar15 * fVar4 + fVar20 * fVar5;
  puVar8 = &Imath_3_2::identity33f;
  uVar9 = 0;
  bVar11 = false;
  do {
    lVar10 = 0;
    do {
      fVar1 = pfVar7[lVar10];
      fVar2 = *(float *)((long)puVar8 + lVar10 * 4);
      if (e < (float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                     (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1))) {
        if (!bVar11) {
          __assert_fail("ident1.equalWithAbsError (identity33f, e)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInvert.cpp"
                        ,0x32,"void (anonymous namespace)::invertM33f(const M33f &, float)");
        }
        goto LAB_001379ec;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    bVar11 = 1 < uVar9;
    uVar9 = uVar9 + 1;
    puVar8 = (undefined8 *)((long)puVar8 + 0xc);
    pfVar7 = pfVar7 + 3;
  } while (uVar9 != 3);
LAB_001379ec:
  puVar8 = &Imath_3_2::identity33f;
  pfVar7 = &local_b8;
  uVar9 = 0;
  bVar11 = false;
  do {
    lVar10 = 0;
    do {
      fVar1 = pfVar7[lVar10];
      fVar2 = *(float *)((long)puVar8 + lVar10 * 4);
      if (e < (float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                     (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1))) {
        if (bVar11) {
          return;
        }
        __assert_fail("ident2.equalWithAbsError (identity33f, e)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInvert.cpp"
                      ,0x33,"void (anonymous namespace)::invertM33f(const M33f &, float)");
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    bVar11 = 1 < uVar9;
    uVar9 = uVar9 + 1;
    puVar8 = (undefined8 *)((long)puVar8 + 0xc);
    pfVar7 = pfVar7 + 3;
  } while (uVar9 != 3);
  return;
}

Assistant:

void
invertM33f (const M33f& m, float e)
{
    M33f inv1   = m.inverse ();
    M33f inv2   = m.gjInverse ();
    M33f ident1 = m * inv1;
    M33f ident2 = m * inv2;

    //cout << "m\n" << m << endl;
    //cout << "inv1\n" << inv1 << "ident1\n" << ident1 << endl;
    //cout << "inv2\n" << inv2 << "ident2\n" << ident2 << endl;

    assert (ident1.equalWithAbsError (identity33f, e));
    assert (ident2.equalWithAbsError (identity33f, e));
}